

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O1

void nn_binproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_sinproc *self_00;
  nn_list_item *it;
  
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (type == 6) {
        nn_sinproc_stop((nn_sinproc *)srcptr);
        return;
      }
      if (type != 7) {
        return;
      }
      nn_list_erase((nn_list *)&self[1].ctx,(nn_list_item *)((long)srcptr + 0x280));
      nn_sinproc_term((nn_sinproc *)srcptr);
      nn_free(srcptr);
      return;
    }
    if (src == 0x6c41) {
      if (type != 1) goto LAB_0013454d;
      self_00 = (nn_sinproc *)nn_alloc_(0x290);
      if (self_00 != (nn_sinproc *)0x0) {
        nn_sinproc_init(self_00,1,(nn_ep *)self[1].srcptr,self);
        it = nn_list_end((nn_list *)&self[1].ctx);
        nn_list_insert((nn_list *)&self[1].ctx,&self_00->item,it);
        nn_sinproc_accept(self_00,(nn_sinproc *)srcptr);
        return;
      }
      nn_binproc_handler_cold_2();
      goto LAB_00134537;
    }
  }
  else {
    if (*(int *)&self[1].fn == 1) {
      if (src != -2) goto LAB_0013453c;
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
    }
    else {
LAB_00134537:
      nn_binproc_handler_cold_6();
LAB_0013453c:
      nn_binproc_handler_cold_4();
    }
    nn_binproc_handler_cold_5();
  }
  nn_binproc_handler_cold_3();
LAB_0013454d:
  nn_binproc_handler_cold_1();
}

Assistant:

static void nn_binproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_binproc *binproc;
    struct nn_sinproc *peer;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, fsm);

    switch (binproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                binproc->state = NN_BINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_BINPROC_STATE_ACTIVE:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_CONNECT:
                peer = (struct nn_sinproc*) srcptr;
                sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
                alloc_assert (sinproc);
                nn_sinproc_init (sinproc, NN_BINPROC_SRC_SINPROC,
                    binproc->item.ep, &binproc->fsm);
                nn_list_insert (&binproc->sinprocs, &sinproc->item,
                    nn_list_end (&binproc->sinprocs));
                nn_sinproc_accept (sinproc, peer);
                return;
            default:
                nn_fsm_bad_action (binproc->state, src, type);
            }

        case NN_BINPROC_SRC_SINPROC:
            sinproc = srcptr;
            switch (type) {
            case NN_SINPROC_STOPPED:
                nn_list_erase (&binproc->sinprocs, &sinproc->item);
                nn_sinproc_term (sinproc);
                nn_free (sinproc);
                return;
            case NN_SINPROC_DISCONNECT:
                nn_sinproc_stop (sinproc);
                return;
            }
            return;

        default:
            nn_fsm_bad_source (binproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (binproc->state, src, type);
    }
}